

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void __thiscall n_e_s::core::Pipeline::execute_step(Pipeline *this)

{
  bool bVar1;
  StepResult SVar2;
  reference this_00;
  StepResult res;
  Pipeline *this_local;
  
  bVar1 = std::
          deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
          ::empty(&this->steps_);
  if (!bVar1) {
    this_00 = std::
              deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
              ::front(&this->steps_);
    SVar2 = std::function<n_e_s::core::StepResult_()>::operator()(this_00);
    std::
    deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
    ::pop_front(&this->steps_);
    this->continue_ = SVar2 != Stop;
    if (SVar2 == Skip) {
      execute_step(this);
    }
  }
  return;
}

Assistant:

void Pipeline::execute_step() {
    if (!steps_.empty()) {
        const StepResult res = steps_.front()();
        steps_.pop_front();

        continue_ = res != StepResult::Stop;

        if (res == StepResult::Skip) {
            execute_step();
        }
    }
}